

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

void emit_restart(j_compress_ptr cinfo,int restart_num)

{
  long lVar1;
  long in_RDI;
  jpeg_component_info *compptr;
  int ci;
  arith_entropy_ptr entropy;
  j_compress_ptr in_stack_ffffffffffffffd8;
  long lVar2;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int iVar3;
  
  lVar1 = *(long *)(in_RDI + 0x1f0);
  finish_pass((j_compress_ptr)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  emit_byte(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
  emit_byte(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
  for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 0x144); iVar3 = iVar3 + 1) {
    lVar2 = *(long *)(in_RDI + 0x148 + (long)iVar3 * 8);
    if ((*(int *)(in_RDI + 0x134) == 0) ||
       ((*(int *)(in_RDI + 0x19c) == 0 && (*(int *)(in_RDI + 0x1a4) == 0)))) {
      memset(*(void **)(lVar1 + 0x68 + (long)*(int *)(lVar2 + 0x14) * 8),0,0x40);
      *(undefined4 *)(lVar1 + 0x40 + (long)iVar3 * 4) = 0;
      *(undefined4 *)(lVar1 + 0x50 + (long)iVar3 * 4) = 0;
    }
    if ((*(int *)(in_RDI + 0x134) == 0) || (*(int *)(in_RDI + 0x1a0) != 0)) {
      memset(*(void **)(lVar1 + 0xe8 + (long)*(int *)(lVar2 + 0x18) * 8),0,0x100);
    }
  }
  *(undefined8 *)(lVar1 + 0x18) = 0;
  *(undefined8 *)(lVar1 + 0x20) = 0x10000;
  *(undefined8 *)(lVar1 + 0x28) = 0;
  *(undefined8 *)(lVar1 + 0x30) = 0;
  *(undefined4 *)(lVar1 + 0x38) = 0xb;
  *(undefined4 *)(lVar1 + 0x3c) = 0xffffffff;
  return;
}

Assistant:

LOCAL(void)
emit_restart(phuff_entropy_ptr entropy, int restart_num)
{
  int ci;

  emit_eobrun(entropy);

  if (!entropy->gather_statistics) {
    flush_bits(entropy);
    emit_byte(entropy, 0xFF);
    emit_byte(entropy, JPEG_RST0 + restart_num);
  }

  if (entropy->cinfo->Ss == 0) {
    /* Re-initialize DC predictions to 0 */
    for (ci = 0; ci < entropy->cinfo->comps_in_scan; ci++)
      entropy->last_dc_val[ci] = 0;
  } else {
    /* Re-initialize all AC-related fields to 0 */
    entropy->EOBRUN = 0;
    entropy->BE = 0;
  }
}